

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groupnorm_x86.cpp
# Opt level: O3

int __thiscall
ncnn::GroupNorm_x86::forward_inplace(GroupNorm_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  _func_int **pp_Var2;
  void *pvVar3;
  ulong uVar4;
  float fVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  float *pfVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  _func_int *p_Var18;
  uint uVar19;
  long lVar20;
  float *pfVar21;
  float *pfVar22;
  uint uVar23;
  long lVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar31 [16];
  float fVar35;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  __m128 _scale2;
  _func_int *local_40;
  
  iVar13 = bottom_top_blob->dims;
  pp_Var2 = this->_vptr_GroupNorm_x86;
  local_40 = pp_Var2[-3];
  p_Var18 = (_func_int *)((long)&this->_vptr_GroupNorm_x86 + (long)local_40);
  iVar1 = *(int *)(&this->field_0xd0 + (long)local_40);
  uVar4 = (long)*(int *)(&this->field_0xd4 + (long)local_40) / (long)iVar1;
  uVar10 = uVar4 & 0xffffffff;
  uVar9 = (uint)uVar4;
  if (iVar13 == 2) {
    if (0 < iVar1) {
      uVar6 = bottom_top_blob->w;
      uVar23 = uVar6 * uVar9;
      uVar19 = uVar23 & 0xfffffffc;
      lVar20 = 0;
      do {
        lVar11 = lVar20 * (int)uVar9;
        pfVar21 = (float *)(bottom_top_blob->w * lVar11 * bottom_top_blob->elemsize +
                           (long)bottom_top_blob->data);
        fVar25 = 0.0;
        fVar27 = 0.0;
        fVar28 = 0.0;
        fVar29 = 0.0;
        pfVar12 = pfVar21;
        fVar26 = 0.0;
        uVar17 = 0;
        if (3 < (int)uVar23) {
          iVar13 = 3;
          do {
            fVar25 = fVar25 + *pfVar12;
            fVar27 = fVar27 + pfVar12[1];
            fVar28 = fVar28 + pfVar12[2];
            fVar29 = fVar29 + pfVar12[3];
            pfVar12 = pfVar12 + 4;
            iVar13 = iVar13 + 4;
            fVar26 = fVar25;
            uVar17 = uVar19;
          } while (iVar13 < (int)uVar23);
        }
        fVar26 = fVar29 + fVar27 + fVar28 + fVar26;
        if (uVar23 - uVar17 != 0 && (int)uVar17 <= (int)uVar23) {
          lVar24 = 0;
          do {
            fVar26 = fVar26 + pfVar12[lVar24];
            lVar24 = lVar24 + 1;
          } while (uVar23 - uVar17 != (int)lVar24);
        }
        fVar26 = fVar26 * (1.0 / (float)(int)uVar23);
        pfVar12 = pfVar21;
        if ((int)uVar23 < 4) {
          fVar25 = 0.0;
          fVar27 = 0.0;
          fVar28 = 0.0;
          fVar29 = 0.0;
          uVar17 = 0;
        }
        else {
          fVar25 = 0.0;
          fVar27 = 0.0;
          fVar28 = 0.0;
          fVar29 = 0.0;
          iVar13 = 3;
          do {
            fVar25 = fVar25 + (*pfVar12 - fVar26) * (*pfVar12 - fVar26);
            fVar27 = fVar27 + (pfVar12[1] - fVar26) * (pfVar12[1] - fVar26);
            fVar28 = fVar28 + (pfVar12[2] - fVar26) * (pfVar12[2] - fVar26);
            fVar29 = fVar29 + (pfVar12[3] - fVar26) * (pfVar12[3] - fVar26);
            pfVar12 = pfVar12 + 4;
            iVar13 = iVar13 + 4;
            uVar17 = uVar19;
          } while (iVar13 < (int)uVar23);
        }
        fVar29 = fVar29 + fVar27;
        auVar31._4_4_ = fVar29;
        auVar31._0_4_ = fVar29;
        auVar31._8_4_ = fVar29;
        auVar31._12_4_ = fVar29;
        auVar38._4_12_ = auVar31._4_12_;
        fVar29 = fVar29 + fVar28 + fVar25;
        if (uVar23 - uVar17 != 0 && (int)uVar17 <= (int)uVar23) {
          lVar24 = 0;
          do {
            fVar29 = fVar29 + (pfVar12[lVar24] - fVar26) * (pfVar12[lVar24] - fVar26);
            lVar24 = lVar24 + 1;
          } while (uVar23 - uVar17 != (int)lVar24);
        }
        auVar38._0_4_ = fVar29 * (1.0 / (float)(int)uVar23) + *(float *)(p_Var18 + 0xd8);
        auVar31 = rsqrtss(ZEXT816(0),auVar38);
        fVar25 = auVar31._0_4_;
        fVar25 = fVar25 * -0.5 * (auVar38._0_4_ * fVar25 * fVar25 + -3.0);
        fVar26 = -fVar26 * fVar25;
        if (*(int *)(p_Var18 + 0xdc) == 0) {
          uVar17 = 0;
          if (3 < (int)uVar23) {
            iVar13 = 3;
            do {
              *pfVar21 = *pfVar21 * fVar25 + fVar26;
              pfVar21[1] = pfVar21[1] * fVar25 + fVar26;
              pfVar21[2] = pfVar21[2] * fVar25 + fVar26;
              pfVar21[3] = pfVar21[3] * fVar25 + fVar26;
              pfVar21 = pfVar21 + 4;
              iVar13 = iVar13 + 4;
              uVar17 = uVar19;
            } while (iVar13 < (int)uVar23);
          }
          if (uVar23 - uVar17 != 0 && (int)uVar17 <= (int)uVar23) {
            lVar11 = 0;
            do {
              pfVar21[lVar11] = pfVar21[lVar11] * fVar25 + fVar26;
              lVar11 = lVar11 + 1;
            } while (uVar23 - uVar17 != (int)lVar11);
          }
        }
        else if (0 < (int)uVar9) {
          pfVar22 = (float *)(*(long *)(p_Var18 + 0xf0) * lVar11 + *(long *)(p_Var18 + 0xe0));
          pfVar12 = (float *)(lVar11 * *(long *)(p_Var18 + 0x138) + *(long *)(p_Var18 + 0x128));
          uVar17 = 0;
          do {
            fVar28 = *pfVar22 * fVar25;
            fVar27 = *pfVar22 * fVar26 + *pfVar12;
            if ((int)uVar6 < 4) {
              uVar14 = 0;
            }
            else {
              iVar13 = 3;
              do {
                *pfVar21 = *pfVar21 * fVar28 + fVar27;
                pfVar21[1] = pfVar21[1] * fVar28 + fVar27;
                pfVar21[2] = pfVar21[2] * fVar28 + fVar27;
                pfVar21[3] = pfVar21[3] * fVar28 + fVar27;
                pfVar21 = pfVar21 + 4;
                iVar13 = iVar13 + 4;
                uVar14 = uVar6 & 0xfffffffc;
              } while (iVar13 < (int)uVar6);
            }
            iVar13 = uVar6 - uVar14;
            if (iVar13 != 0 && (int)uVar14 <= (int)uVar6) {
              do {
                *pfVar21 = *pfVar21 * fVar28 + fVar27;
                pfVar21 = pfVar21 + 1;
                iVar13 = iVar13 + -1;
              } while (iVar13 != 0);
            }
            pfVar22 = pfVar22 + 1;
            pfVar12 = pfVar12 + 1;
            uVar17 = uVar17 + 1;
          } while (uVar17 != uVar9);
        }
        lVar20 = lVar20 + 1;
        p_Var18 = (_func_int *)((long)&this->_vptr_GroupNorm_x86 + (long)pp_Var2[-3]);
      } while (lVar20 < *(int *)(&this->field_0xd0 + (long)pp_Var2[-3]));
    }
  }
  else if (iVar13 == 1) {
    if (0 < iVar1) {
      uVar6 = uVar9 & 0xfffffffc;
      lVar20 = 0;
      do {
        lVar11 = lVar20 * (int)uVar9;
        pfVar21 = (float *)(bottom_top_blob->elemsize * lVar11 + (long)bottom_top_blob->data);
        fVar25 = 0.0;
        fVar27 = 0.0;
        fVar28 = 0.0;
        fVar29 = 0.0;
        pfVar12 = pfVar21;
        fVar26 = 0.0;
        uVar23 = 0;
        if (3 < (int)uVar9) {
          iVar13 = 3;
          do {
            fVar25 = fVar25 + *pfVar12;
            fVar27 = fVar27 + pfVar12[1];
            fVar28 = fVar28 + pfVar12[2];
            fVar29 = fVar29 + pfVar12[3];
            pfVar12 = pfVar12 + 4;
            iVar13 = iVar13 + 4;
            fVar26 = fVar25;
            uVar23 = uVar6;
          } while (iVar13 < (int)uVar9);
        }
        fVar26 = fVar29 + fVar27 + fVar28 + fVar26;
        if ((int)uVar23 < (int)uVar9) {
          lVar24 = 0;
          do {
            fVar26 = fVar26 + pfVar12[lVar24];
            lVar24 = lVar24 + 1;
          } while (uVar9 - uVar23 != (int)lVar24);
        }
        fVar26 = fVar26 * (1.0 / (float)(int)uVar9);
        pfVar12 = pfVar21;
        if ((int)uVar9 < 4) {
          fVar25 = 0.0;
          fVar27 = 0.0;
          fVar28 = 0.0;
          fVar29 = 0.0;
          uVar23 = 0;
        }
        else {
          fVar25 = 0.0;
          fVar27 = 0.0;
          fVar28 = 0.0;
          fVar29 = 0.0;
          iVar13 = 3;
          do {
            fVar25 = fVar25 + (*pfVar12 - fVar26) * (*pfVar12 - fVar26);
            fVar27 = fVar27 + (pfVar12[1] - fVar26) * (pfVar12[1] - fVar26);
            fVar28 = fVar28 + (pfVar12[2] - fVar26) * (pfVar12[2] - fVar26);
            fVar29 = fVar29 + (pfVar12[3] - fVar26) * (pfVar12[3] - fVar26);
            pfVar12 = pfVar12 + 4;
            iVar13 = iVar13 + 4;
            uVar23 = uVar6;
          } while (iVar13 < (int)uVar9);
        }
        fVar29 = fVar29 + fVar27;
        auVar36._4_4_ = fVar29;
        auVar36._0_4_ = fVar29;
        auVar36._8_4_ = fVar29;
        auVar36._12_4_ = fVar29;
        auVar37._4_12_ = auVar36._4_12_;
        fVar29 = fVar29 + fVar28 + fVar25;
        if ((int)uVar23 < (int)uVar9) {
          lVar24 = 0;
          do {
            fVar29 = fVar29 + (pfVar12[lVar24] - fVar26) * (pfVar12[lVar24] - fVar26);
            lVar24 = lVar24 + 1;
          } while (uVar9 - uVar23 != (int)lVar24);
        }
        auVar37._0_4_ = fVar29 * (1.0 / (float)(int)uVar9) + *(float *)(p_Var18 + 0xd8);
        auVar31 = rsqrtss(ZEXT816(0),auVar37);
        fVar25 = auVar31._0_4_;
        fVar25 = fVar25 * -0.5 * (auVar37._0_4_ * fVar25 * fVar25 + -3.0);
        fVar26 = -fVar26 * fVar25;
        if (*(int *)(p_Var18 + 0xdc) == 0) {
          uVar23 = 0;
          if (3 < (int)uVar9) {
            iVar13 = 3;
            do {
              *pfVar21 = *pfVar21 * fVar25 + fVar26;
              pfVar21[1] = pfVar21[1] * fVar25 + fVar26;
              pfVar21[2] = pfVar21[2] * fVar25 + fVar26;
              pfVar21[3] = pfVar21[3] * fVar25 + fVar26;
              pfVar21 = pfVar21 + 4;
              iVar13 = iVar13 + 4;
              uVar23 = uVar6;
            } while (iVar13 < (int)uVar9);
          }
          if ((int)uVar23 < (int)uVar9) {
            lVar11 = 0;
            do {
              pfVar21[lVar11] = pfVar21[lVar11] * fVar25 + fVar26;
              lVar11 = lVar11 + 1;
            } while (uVar9 - uVar23 != (int)lVar11);
          }
        }
        else {
          pfVar22 = (float *)(*(long *)(p_Var18 + 0xf0) * lVar11 + *(long *)(p_Var18 + 0xe0));
          pfVar12 = (float *)(lVar11 * *(long *)(p_Var18 + 0x138) + *(long *)(p_Var18 + 0x128));
          uVar23 = 0;
          if (3 < (int)uVar9) {
            iVar13 = 3;
            do {
              fVar27 = pfVar22[1];
              fVar28 = pfVar22[2];
              fVar29 = pfVar22[3];
              fVar35 = pfVar12[1];
              fVar30 = pfVar12[2];
              fVar5 = pfVar12[3];
              *pfVar21 = (*pfVar21 * fVar25 + fVar26) * *pfVar22 + *pfVar12;
              pfVar21[1] = (pfVar21[1] * fVar25 + fVar26) * fVar27 + fVar35;
              pfVar21[2] = (pfVar21[2] * fVar25 + fVar26) * fVar28 + fVar30;
              pfVar21[3] = (pfVar21[3] * fVar25 + fVar26) * fVar29 + fVar5;
              pfVar22 = pfVar22 + 4;
              pfVar12 = pfVar12 + 4;
              pfVar21 = pfVar21 + 4;
              iVar13 = iVar13 + 4;
              uVar23 = uVar6;
            } while (iVar13 < (int)uVar9);
          }
          if ((int)uVar23 < (int)uVar9) {
            lVar11 = 0;
            do {
              pfVar21[lVar11] =
                   (pfVar21[lVar11] * fVar25 + fVar26) * pfVar22[lVar11] + pfVar12[lVar11];
              lVar11 = lVar11 + 1;
            } while (uVar9 - uVar23 != (int)lVar11);
          }
        }
        lVar20 = lVar20 + 1;
        p_Var18 = (_func_int *)((long)&this->_vptr_GroupNorm_x86 + (long)pp_Var2[-3]);
      } while (lVar20 < *(int *)(&this->field_0xd0 + (long)pp_Var2[-3]));
    }
  }
  else if ((iVar13 - 3U < 2) && (0 < iVar1)) {
    uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    uVar23 = uVar6 & 0xfffffffc;
    fVar26 = 1.0 / (float)(int)(uVar6 * uVar9);
    lVar20 = 0;
    do {
      lVar11 = lVar20 * (int)uVar9;
      uVar4 = bottom_top_blob->elemsize;
      lVar24 = bottom_top_blob->cstep * lVar11 * uVar4;
      pvVar3 = bottom_top_blob->data;
      uVar7 = ((long)bottom_top_blob->d * uVar4 *
               (long)bottom_top_blob->h * (long)bottom_top_blob->w + 0xf & 0xfffffffffffffff0) /
              uVar4;
      if ((int)uVar9 < 1) {
        fVar25 = 0.0;
        auVar33 = ZEXT816(0);
      }
      else {
        lVar8 = uVar7 * uVar4;
        fVar25 = 0.0;
        uVar15 = 0;
        do {
          pfVar12 = (float *)((long)pvVar3 + lVar8 * uVar15 + lVar24);
          if ((int)uVar6 < 4) {
            fVar27 = 0.0;
            fVar28 = 0.0;
            fVar29 = 0.0;
            fVar35 = 0.0;
            uVar19 = 0;
          }
          else {
            fVar27 = 0.0;
            fVar28 = 0.0;
            fVar29 = 0.0;
            fVar35 = 0.0;
            iVar13 = 3;
            do {
              fVar27 = fVar27 + *pfVar12;
              fVar28 = fVar28 + pfVar12[1];
              fVar29 = fVar29 + pfVar12[2];
              fVar35 = fVar35 + pfVar12[3];
              pfVar12 = pfVar12 + 4;
              iVar13 = iVar13 + 4;
              uVar19 = uVar23;
            } while (iVar13 < (int)uVar6);
          }
          fVar25 = fVar35 + fVar28 + fVar25 + fVar29 + fVar27;
          if (uVar6 - uVar19 != 0 && (int)uVar19 <= (int)uVar6) {
            lVar16 = 0;
            do {
              fVar25 = fVar25 + pfVar12[lVar16];
              lVar16 = lVar16 + 1;
            } while (uVar6 - uVar19 != (int)lVar16);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar10);
        fVar25 = fVar25 * fVar26;
        if ((int)uVar9 < 1) {
          auVar33 = ZEXT816(0);
        }
        else {
          auVar33 = ZEXT816(0);
          uVar15 = 0;
          do {
            pfVar12 = (float *)((long)pvVar3 + lVar8 * uVar15 + lVar24);
            if ((int)uVar6 < 4) {
              fVar27 = 0.0;
              fVar28 = 0.0;
              fVar29 = 0.0;
              fVar35 = 0.0;
              uVar19 = 0;
            }
            else {
              fVar27 = 0.0;
              fVar28 = 0.0;
              fVar29 = 0.0;
              fVar35 = 0.0;
              iVar13 = 3;
              do {
                fVar27 = fVar27 + (*pfVar12 - fVar25) * (*pfVar12 - fVar25);
                fVar28 = fVar28 + (pfVar12[1] - fVar25) * (pfVar12[1] - fVar25);
                fVar29 = fVar29 + (pfVar12[2] - fVar25) * (pfVar12[2] - fVar25);
                fVar35 = fVar35 + (pfVar12[3] - fVar25) * (pfVar12[3] - fVar25);
                pfVar12 = pfVar12 + 4;
                iVar13 = iVar13 + 4;
                uVar19 = uVar23;
              } while (iVar13 < (int)uVar6);
            }
            fVar30 = auVar33._0_4_;
            auVar32._4_4_ = fVar35 + fVar28;
            auVar32._0_4_ = auVar32._4_4_;
            auVar32._8_4_ = auVar32._4_4_;
            auVar32._12_4_ = auVar32._4_4_;
            auVar33._4_12_ = auVar32._4_12_;
            auVar33._0_4_ = auVar32._4_4_ + fVar30 + fVar29 + fVar27;
            if (uVar6 - uVar19 != 0 && (int)uVar19 <= (int)uVar6) {
              lVar16 = 0;
              do {
                auVar33._0_4_ =
                     auVar33._0_4_ + (pfVar12[lVar16] - fVar25) * (pfVar12[lVar16] - fVar25);
                lVar16 = lVar16 + 1;
              } while (uVar6 - uVar19 != (int)lVar16);
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 != uVar10);
        }
      }
      auVar34._4_12_ = auVar33._4_12_;
      auVar34._0_4_ = auVar33._0_4_ * fVar26 + *(float *)(&this->field_0xd8 + (long)local_40);
      auVar31 = rsqrtss(ZEXT816(0),auVar34);
      fVar27 = auVar31._0_4_;
      if (0 < (int)uVar9) {
        pfVar12 = (float *)(*(long *)(p_Var18 + 0xf0) * lVar11 + *(long *)(p_Var18 + 0xe0));
        pfVar21 = (float *)(lVar11 * *(long *)(p_Var18 + 0x138) + *(long *)(p_Var18 + 0x128));
        fVar27 = fVar27 * -0.5 * (auVar34._0_4_ * fVar27 * fVar27 + -3.0);
        uVar15 = 0;
        do {
          fVar28 = fVar27;
          fVar29 = -fVar25 * fVar27;
          if (*(int *)(&this->field_0xdc + (long)pp_Var2[-3]) != 0) {
            fVar28 = *pfVar12 * fVar27;
            fVar29 = *pfVar12 * -fVar25 * fVar27 + *pfVar21;
          }
          pfVar22 = (float *)((long)pvVar3 + uVar7 * uVar4 * uVar15 + lVar24);
          uVar19 = 0;
          if (3 < (int)uVar6) {
            iVar13 = 3;
            do {
              *pfVar22 = *pfVar22 * fVar28 + fVar29;
              pfVar22[1] = pfVar22[1] * fVar28 + fVar29;
              pfVar22[2] = pfVar22[2] * fVar28 + fVar29;
              pfVar22[3] = pfVar22[3] * fVar28 + fVar29;
              pfVar22 = pfVar22 + 4;
              iVar13 = iVar13 + 4;
              uVar19 = uVar23;
            } while (iVar13 < (int)uVar6);
          }
          if (uVar6 - uVar19 != 0 && (int)uVar19 <= (int)uVar6) {
            lVar11 = 0;
            do {
              pfVar22[lVar11] = pfVar22[lVar11] * fVar28 + fVar29;
              lVar11 = lVar11 + 1;
            } while (uVar6 - uVar19 != (int)lVar11);
          }
          pfVar12 = pfVar12 + 1;
          pfVar21 = pfVar21 + 1;
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar10);
        local_40 = pp_Var2[-3];
      }
      lVar20 = lVar20 + 1;
      p_Var18 = (_func_int *)((long)&this->_vptr_GroupNorm_x86 + (long)local_40);
    } while (lVar20 < *(int *)(&this->field_0xd0 + (long)local_40));
  }
  return 0;
}

Assistant:

int GroupNorm_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    const int dims = bottom_top_blob.dims;
    const int channels_per_group = channels / group;

    if (dims == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < channels_per_group; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < channels_per_group; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < channels_per_group; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / channels_per_group;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / channels_per_group + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                int i = 0;
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _gamma = _mm512_loadu_ps(gamma);
                    __m512 _beta = _mm512_loadu_ps(beta);
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _a = _mm512_mul_ps(_gamma, _scale1_avx512);
                    __m512 _b = _mm512_add_ps(_mm512_mul_ps(_gamma, _scale2_avx512), _beta);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a), _b);
                    _mm512_storeu_ps(ptr, _p);
                    gamma += 16;
                    beta += 16;
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _gamma = _mm256_loadu_ps(gamma);
                    __m256 _beta = _mm256_loadu_ps(beta);
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _a = _mm256_mul_ps(_gamma, _scale1_avx);
                    __m256 _b = _mm256_comp_fmadd_ps(_gamma, _scale2_avx, _beta);
                    _p = _mm256_comp_fmadd_ps(_p, _a, _b);
                    _mm256_storeu_ps(ptr, _p);
                    gamma += 8;
                    beta += 8;
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _gamma = _mm_loadu_ps(gamma);
                    __m128 _beta = _mm_loadu_ps(beta);
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _a = _mm_mul_ps(_gamma, _scale1);
                    __m128 _b = _mm_comp_fmadd_ps(_gamma, _scale2, _beta);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    gamma += 4;
                    beta += 4;
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    *ptr = *ptr * a + b;
                    gamma++;
                    beta++;
                    ptr++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int size = channels_per_group * w;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.row_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / size;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / size + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
                for (int q = 0; q < channels_per_group; q++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _a_avx512 = _mm512_set1_ps(a);
                    __m512 _b_avx512 = _mm512_set1_ps(b);
                    for (; i + 15 < w; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                        _mm512_storeu_ps(ptr, _p);
                        ptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _a_avx = _mm256_set1_ps(a);
                    __m256 _b_avx = _mm256_set1_ps(b);
                    for (; i + 7 < w; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                        _mm256_storeu_ps(ptr, _p);
                        ptr += 8;
                    }
#endif // __AVX__
                    __m128 _a = _mm_set1_ps(a);
                    __m128 _b = _mm_set1_ps(b);
                    for (; i + 3 < w; i += 4)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_comp_fmadd_ps(_p, _a, _b);
                        _mm_storeu_ps(ptr, _p);
                        ptr += 4;
                    }
#endif // __SSE2__
                    for (; i < w; i++)
                    {
                        *ptr = *ptr * a + b;
                        ptr++;
                    }
                    gamma++;
                    beta++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 3 || dims == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int d = bottom_top_blob.d;
        int size = w * h * d;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.channel_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / (channels_per_group * size);

            float sqsum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / (channels_per_group * size) + eps);
            float scale2 = -mean * scale1;

            const float* gamma = gamma_data_g;
            const float* beta = beta_data_g;
            for (int q = 0; q < channels_per_group; q++)
            {
                float a = scale1;
                float b = scale2;
                if (affine)
                {
                    a = *gamma * a;
                    b = *gamma * b + *beta;
                }

                float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _a_avx512 = _mm512_set1_ps(a);
                __m512 _b_avx512 = _mm512_set1_ps(b);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _a_avx = _mm256_set1_ps(a);
                __m256 _b_avx = _mm256_set1_ps(b);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _a = _mm_set1_ps(a);
                __m128 _b = _mm_set1_ps(b);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * a + b;
                    ptr++;
                }

                gamma++;
                beta++;
            }
        }

        return 0;
    }

    return 0;
}